

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

void __thiscall
duckdb::SerializedCSVReaderOptions::Serialize
          (SerializedCSVReaderOptions *this,Serializer *serializer)

{
  CSVOption<char> CVar1;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  char local_58 [8];
  char local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,100,"ignore_errors",&(this->options).ignore_errors,(bool *)local_68);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x65,"buffer_sample_size",&(this->options).buffer_sample_size);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x66,"null_str",&(this->options).null_str);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"compression");
  Serializer::WriteValue<duckdb::FileCompressionType>(serializer,(this->options).compression);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x68,"allow_quoted_nulls",&(this->options).allow_quoted_nulls);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (serializer,0x69,"maximum_line_size",&(this->options).maximum_line_size);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x6a,"normalize_names",&(this->options).normalize_names);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (serializer,0x6b,"force_not_null",&(this->options).force_not_null);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x6c,"all_varchar",&(this->options).all_varchar);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x6d,"sample_size_chunks",&(this->options).sample_size_chunks);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x6e,"auto_detect",&(this->options).auto_detect);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x6f,"file_path",&(this->options).file_path);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x70,"decimal_separator",&(this->options).decimal_separator);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x71,"null_padding",&(this->options).null_padding);
  Serializer::WriteProperty<duckdb::MultiFileOptions>
            (serializer,0x73,"file_options",&this->file_options);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (serializer,0x74,"force_quote",&(this->options).force_quote);
  local_68 = (undefined1  [8])local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"reject_errors","");
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x75,"rejects_table_name",&(this->options).rejects_table_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (local_68 != (undefined1  [8])local_58) {
    operator_delete((void *)local_68);
  }
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x76,"rejects_limit",&(this->options).rejects_limit);
  CVar1 = CSVReaderOptions::GetSingleByteDelimiter(&this->options);
  local_68[0] = CVar1.set_by_user;
  local_68[1] = CVar1.value;
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (serializer,0x79,"delimiter",(CSVOption<char> *)local_68);
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (serializer,0x7a,"quote",&(this->options).dialect_options.state_machine_options.quote);
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (serializer,0x7b,"escape",&(this->options).dialect_options.state_machine_options.escape)
  ;
  Serializer::WriteProperty<duckdb::CSVOption<bool>>
            (serializer,0x7c,"header",&(this->options).dialect_options.header);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x7d,"num_cols",&(this->options).dialect_options.num_cols);
  Serializer::WriteProperty<duckdb::CSVOption<duckdb::NewLineIdentifier>>
            (serializer,0x7e,"new_line",
             &(this->options).dialect_options.state_machine_options.new_line);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (serializer,0x7f,"skip_rows",&(this->options).dialect_options.skip_rows);
  (*serializer->_vptr_Serializer[2])(serializer,0x80,"date_format");
  Serializer::
  WriteValue<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>
            (serializer,&(this->options).dialect_options.date_format);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x81,"sniffer_user_mismatch_error",
             &(this->options).sniffer_user_mismatch_error);
  Serializer::WritePropertyWithDefault<bool>(serializer,0x82,"parallel",&(this->options).parallel);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (serializer,0x83,"was_type_manually_set",&(this->options).was_type_manually_set);
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"reject_scans","");
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
  local_60._M_p = local_50;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
  Serializer::WritePropertyWithDefault<duckdb::CSVOption<std::__cxx11::string>>
            (serializer,0x84,"rejects_scan_name",&(this->options).rejects_scan_name,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68);
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x85,"name_list",&(this->options).name_list);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x86,"sql_type_list",&(this->options).sql_type_list);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            (serializer,0x87,"sql_types_per_column",&(this->options).sql_types_per_column);
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x88,"columns_set",&(this->options).columns_set,(bool *)local_68);
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffff0000);
  Serializer::WritePropertyWithDefault<duckdb::CSVOption<char>>
            (serializer,0x89,"comment",
             &(this->options).dialect_options.state_machine_options.comment,
             (CSVOption<char> *)local_68);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x8a,"rows_until_header",&(this->options).dialect_options.rows_until_header)
  ;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x8b,"encoding",&(this->options).encoding);
  Serializer::WriteProperty<duckdb::CSVOption<bool>>
            (serializer,0x8c,"strict_mode",
             &(this->options).dialect_options.state_machine_options.strict_mode);
  CSVReaderOptions::GetMultiByteDelimiter_abi_cxx11_
            ((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68,&this->options);
  Serializer::WriteProperty<duckdb::CSVOption<std::__cxx11::string>>
            (serializer,0x8d,"multi_byte_delimiter",
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68);
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x8e,"multi_file_reader",&(this->options).multi_file_reader);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (serializer,0x8f,"buffer_size_option",&(this->options).buffer_size_option);
  return;
}

Assistant:

void SerializedCSVReaderOptions::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<bool>(100, "ignore_errors", options.ignore_errors, false);
	serializer.WritePropertyWithDefault<idx_t>(101, "buffer_sample_size", options.buffer_sample_size);
	serializer.WritePropertyWithDefault<vector<string>>(102, "null_str", options.null_str);
	serializer.WriteProperty<FileCompressionType>(103, "compression", options.compression);
	serializer.WritePropertyWithDefault<bool>(104, "allow_quoted_nulls", options.allow_quoted_nulls);
	serializer.WriteProperty<CSVOption<idx_t>>(105, "maximum_line_size", options.maximum_line_size);
	serializer.WritePropertyWithDefault<bool>(106, "normalize_names", options.normalize_names);
	serializer.WritePropertyWithDefault<vector<bool>>(107, "force_not_null", options.force_not_null);
	serializer.WritePropertyWithDefault<bool>(108, "all_varchar", options.all_varchar);
	serializer.WritePropertyWithDefault<idx_t>(109, "sample_size_chunks", options.sample_size_chunks);
	serializer.WritePropertyWithDefault<bool>(110, "auto_detect", options.auto_detect);
	serializer.WritePropertyWithDefault<string>(111, "file_path", options.file_path);
	serializer.WritePropertyWithDefault<string>(112, "decimal_separator", options.decimal_separator);
	serializer.WritePropertyWithDefault<bool>(113, "null_padding", options.null_padding);
	/* [Deleted] (idx_t) "buffer_size" */
	serializer.WriteProperty<MultiFileOptions>(115, "file_options", file_options);
	serializer.WritePropertyWithDefault<vector<bool>>(116, "force_quote", options.force_quote);
	serializer.WritePropertyWithDefault<string>(117, "rejects_table_name", options.rejects_table_name, "reject_errors");
	serializer.WritePropertyWithDefault<idx_t>(118, "rejects_limit", options.rejects_limit);
	/* [Deleted] (vector<string>) "rejects_recovery_columns" */
	/* [Deleted] (vector<idx_t>) "rejects_recovery_column_ids" */
	serializer.WriteProperty<CSVOption<char>>(121, "delimiter", options.GetSingleByteDelimiter());
	serializer.WriteProperty<CSVOption<char>>(122, "quote", options.dialect_options.state_machine_options.quote);
	serializer.WriteProperty<CSVOption<char>>(123, "escape", options.dialect_options.state_machine_options.escape);
	serializer.WriteProperty<CSVOption<bool>>(124, "header", options.dialect_options.header);
	serializer.WritePropertyWithDefault<idx_t>(125, "num_cols", options.dialect_options.num_cols);
	serializer.WriteProperty<CSVOption<NewLineIdentifier>>(126, "new_line", options.dialect_options.state_machine_options.new_line);
	serializer.WriteProperty<CSVOption<idx_t>>(127, "skip_rows", options.dialect_options.skip_rows);
	serializer.WriteProperty<map<LogicalTypeId, CSVOption<StrpTimeFormat>>>(128, "date_format", options.dialect_options.date_format);
	serializer.WritePropertyWithDefault<string>(129, "sniffer_user_mismatch_error", options.sniffer_user_mismatch_error);
	serializer.WritePropertyWithDefault<bool>(130, "parallel", options.parallel);
	serializer.WritePropertyWithDefault<vector<bool>>(131, "was_type_manually_set", options.was_type_manually_set);
	serializer.WritePropertyWithDefault<CSVOption<string>>(132, "rejects_scan_name", options.rejects_scan_name, {"reject_scans"});
	serializer.WritePropertyWithDefault<vector<string>>(133, "name_list", options.name_list);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(134, "sql_type_list", options.sql_type_list);
	serializer.WritePropertyWithDefault<case_insensitive_map_t<idx_t>>(135, "sql_types_per_column", options.sql_types_per_column);
	serializer.WritePropertyWithDefault<bool>(136, "columns_set", options.columns_set, false);
	serializer.WritePropertyWithDefault<CSVOption<char>>(137, "comment", options.dialect_options.state_machine_options.comment, CSVOption<char>('\0'));
	serializer.WritePropertyWithDefault<idx_t>(138, "rows_until_header", options.dialect_options.rows_until_header);
	serializer.WritePropertyWithDefault<string>(139, "encoding", options.encoding);
	serializer.WriteProperty<CSVOption<bool>>(140, "strict_mode", options.dialect_options.state_machine_options.strict_mode);
	serializer.WriteProperty<CSVOption<string>>(141, "multi_byte_delimiter", options.GetMultiByteDelimiter());
	serializer.WritePropertyWithDefault<bool>(142, "multi_file_reader", options.multi_file_reader);
	serializer.WriteProperty<CSVOption<idx_t>>(143, "buffer_size_option", options.buffer_size_option);
}